

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_event.c
# Opt level: O0

int luv_fs_event_getpath(lua_State *L)

{
  int status;
  uv_fs_event_t *handle_00;
  char local_2028 [4];
  int ret;
  char buf [8192];
  size_t len;
  uv_fs_event_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_fs_event(L,1);
  buf[0x1ff8] = '\0';
  buf[0x1ff9] = ' ';
  buf[0x1ffa] = '\0';
  buf[0x1ffb] = '\0';
  buf[0x1ffc] = '\0';
  buf[0x1ffd] = '\0';
  buf[0x1ffe] = '\0';
  buf[0x1fff] = '\0';
  status = uv_fs_event_getpath(handle_00,local_2028,(size_t *)(buf + 0x1ff8));
  if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    lua_pushlstring(L,local_2028,buf._8184_8_);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_event_getpath(lua_State* L) {
  uv_fs_event_t* handle = luv_check_fs_event(L, 1);
  size_t len = 2*PATH_MAX;
  char buf[2*PATH_MAX];
  int ret = uv_fs_event_getpath(handle, buf, &len);
  if (ret < 0) return luv_error(L, ret);
  lua_pushlstring(L, buf, len);
  return 1;
}